

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_SubDimple::VertexHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDimple *this,ON_SubDHashType hash_type)

{
  ON_SubDLevel *pOVar1;
  uint level_index;
  ON_SubDLevel *pOVar2;
  ON_SubDVertexIdIterator vidit;
  ON_SubDVertexIdIterator OStack_48;
  
  ON_SubDVertexIdIterator::ON_SubDVertexIdIterator(&OStack_48);
  InitializeVertexIdIterator(this,&OStack_48);
  pOVar1 = this->m_active_level;
  level_index = 0;
  pOVar2 = pOVar1;
  if (pOVar1 == (ON_SubDLevel *)0x0) {
    pOVar2 = &ON_SubDLevel::Empty;
  }
  if (pOVar1 != (ON_SubDLevel *)0x0) {
    level_index = pOVar1->m_level_index;
  }
  Internal_VertexHash(__return_storage_ptr__,hash_type,pOVar2->m_vertex[0],level_index,&OStack_48);
  ON_SubDRef::~ON_SubDRef(&OStack_48.m_subd_ref);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDimple::VertexHash(ON_SubDHashType hash_type) const
{
  ON_SubDVertexIdIterator vidit;
  this->InitializeVertexIdIterator(vidit);
  return Internal_VertexHash(hash_type, ActiveLevel().m_vertex[0], this->ActiveLevelIndex(), vidit);
}